

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_multiply_target_and_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>>
          (Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Field_element *val,
          set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
          *column)

{
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
  *this_00;
  ID_index IVar1;
  _Rb_tree_color _Var2;
  undefined4 uVar3;
  undefined8 *puVar4;
  _Rb_tree_color *p_Var5;
  long lVar6;
  bool bVar7;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *in_RAX;
  _ValueType __value;
  _Rb_tree_node_base *p_Var8;
  undefined4 *puVar9;
  _Base_ptr p_Var10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  iterator __begin0;
  undefined8 *puVar15;
  _Rb_tree_header *p_Var16;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_38;
  
  local_38 = in_RAX;
  if (*val == 0) {
    puVar4 = *(undefined8 **)(this + 0x10);
    for (puVar15 = *(undefined8 **)(this + 8); puVar15 != puVar4; puVar15 = puVar15 + 1) {
      if ((void *)*puVar15 != (void *)0x0) {
        operator_delete((void *)*puVar15,8);
      }
    }
    if (*(long *)(this + 0x10) != *(long *)(this + 8)) {
      *(long *)(this + 0x10) = *(long *)(this + 8);
    }
    *(undefined4 *)(this + 0x20) = 0;
  }
  this_00 = (vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
             *)(this + 8);
  puVar15 = *(undefined8 **)(this + 8);
  puVar4 = *(undefined8 **)(this + 0x10);
  if (puVar15 == puVar4) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              *)this_00,(column->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
    p_Var10 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(column->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var16) {
      uVar12 = 0;
      do {
        uVar3 = *(undefined4 *)&p_Var10[1].field_0x4;
        puVar9 = (undefined4 *)operator_new(8);
        *puVar9 = 0;
        puVar9[1] = uVar3;
        *(undefined4 **)(*(long *)this_00 + uVar12 * 8) = puVar9;
        **(_Rb_tree_color **)(*(long *)this_00 + uVar12 * 8) = p_Var10[1]._M_color;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        uVar12 = (ulong)((int)uVar12 + 1);
      } while ((_Rb_tree_header *)p_Var10 != p_Var16);
    }
    *(int *)(this + 0x20) = (int)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3);
  }
  else {
    do {
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x28),(Element *)*puVar15,*val)
      ;
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar4);
    for (p_Var8 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(column->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
      IVar1 = *(ID_index *)&p_Var8[1].field_0x4;
      local_38 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(8);
      (local_38->super_Entry_field_element_option).element_ = 0;
      local_38->rowIndex_ = IVar1;
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
      ::
      emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                (this_00,&local_38);
      lVar11 = *(long *)(this + 0x10);
      p_Var5 = *(_Rb_tree_color **)(lVar11 + -8);
      *p_Var5 = p_Var8[1]._M_color;
      lVar6 = *(long *)(this + 8);
      lVar13 = lVar11 - lVar6 >> 3;
      lVar11 = lVar13 + -1;
      if (1 < lVar13) {
        _Var2 = p_Var5[1];
        do {
          lVar14 = (lVar11 - (lVar11 + -1 >> 0x3f)) + -1 >> 1;
          lVar13 = *(long *)(lVar6 + lVar14 * 8);
          if (_Var2 <= *(_Rb_tree_color *)(lVar13 + 4)) break;
          *(long *)(lVar6 + lVar11 * 8) = lVar13;
          bVar7 = 2 < lVar11;
          lVar11 = lVar14;
        } while (bVar7);
      }
      *(_Rb_tree_color **)(lVar6 + lVar11 * 8) = p_Var5;
    }
    if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 3) <
        (ulong)(uint)(*(int *)(this + 0x20) * 2)) {
      Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
  }
  return true;
}

Assistant:

inline bool Heap_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      column_[i++]->set_element(entry.get_element());
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(0);

  for (Entry* entry : column_) {
    operators_->multiply_inplace(entry->get_element(), val);
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry->get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry->get_element());
    }
  }

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
    }
    column_.push_back(entryPool_->construct(entry.get_row_index()));
    column_.back()->set_element(entry.get_element());
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}